

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double __thiscall IF97::BaseRegion::cvmass(BaseRegion *this,double T,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  
  dVar1 = this->T_star;
  dVar6 = this->p_star;
  dVar3 = cpmass(this,T,p);
  dVar2 = this->R;
  dVar4 = dgammar_dPI(this,T,p);
  dVar5 = d2gammar_dPIdTAU(this,T,p);
  auVar7._0_8_ = -dVar1;
  auVar7._8_8_ = p;
  auVar8._8_8_ = dVar6;
  auVar8._0_8_ = T;
  auVar8 = divpd(auVar7,auVar8);
  dVar9 = auVar8._8_8_;
  dVar6 = auVar8._0_8_ * dVar9 * dVar5 + dVar4 * dVar9 + 1.0;
  dVar1 = d2gammar_dPI2(this,T,p);
  return dVar3 - (dVar6 * dVar6 * dVar2) / (1.0 - dVar9 * dVar9 * dVar1);
}

Assistant:

virtual double cvmass(double T, double p) const{
            const double tau = T_star/T, PI = p/p_star;
            return cpmass(T,p)-R*powi(1 + PI*dgammar_dPI(T,p) - tau*PI*d2gammar_dPIdTAU(T,p),2)/(1-PI*PI*d2gammar_dPI2(T, p));
        }